

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ReporterConfig::ReporterConfig
          (ReporterConfig *this,string *_name,ostream *_stream,bool _includeSuccessfulResults,
          ConfigData *_fullConfig)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  this->stream = _stream;
  this->includeSuccessfulResults = _includeSuccessfulResults;
  ConfigData::ConfigData(&this->fullConfig,_fullConfig);
  return;
}

Assistant:

ReporterConfig( const std::string& _name,
                        std::ostream& _stream,
                        bool _includeSuccessfulResults,
                        const ConfigData& _fullConfig )
        :   name( _name ),
            stream( _stream ),
            includeSuccessfulResults( _includeSuccessfulResults ),
            fullConfig( _fullConfig )
        {}